

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

Int64ToDoubleMap *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::Int64ToDoubleMap>
          (Arena *arena)

{
  Int64ToDoubleMap *pIVar1;
  
  if (arena != (Arena *)0x0) {
    pIVar1 = DoCreateMessage<CoreML::Specification::Int64ToDoubleMap>(arena);
    return pIVar1;
  }
  pIVar1 = (Int64ToDoubleMap *)operator_new(0x48);
  CoreML::Specification::Int64ToDoubleMap::Int64ToDoubleMap(pIVar1,(Arena *)0x0,false);
  return pIVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }